

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

int32_t __thiscall caldate_t::dayno(caldate_t *this)

{
  int32_t iVar1;
  uint uVar2;
  int32_t iVar3;
  div_t dVar4;
  int iVar5;
  int iVar6;
  
  dVar4 = div(this->m + -3,0xc);
  iVar5 = dVar4.rem;
  iVar6 = iVar5 + 0xc;
  if (-1 < (long)dVar4) {
    iVar6 = iVar5;
  }
  iVar5 = this->y + dVar4.quot + (iVar5 >> 0x1f);
  iVar1 = divfl(iVar5,4);
  uVar2 = divfl(iVar5,100);
  iVar3 = divfl(iVar5,400);
  return (iVar6 * 0x132 + 5) / 10 + iVar3 + iVar1 + ~uVar2 + this->d + iVar5 * 0x16d;
}

Assistant:

int32_t dayno() const
    {
        /* 
         *   Adjust the month to our odd range where the year starts in
         *   March: 0 = March, 1 = April, ... 11 = Feb.  (If this yields a
         *   negative remainder, adjust to a positive index by going back a
         *   year.)
         */
        div_t mq = div(this->m - 3, 12);
        if (mq.rem < 0)
            mq.rem += 12, mq.quot -= 1;

        int m = mq.rem;
        int y = this->y + mq.quot;
        return 365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400)
            + (m*306 + 5)/10 + (d-1);
    }